

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O1

int jumponcond(FuncState *fs,expdesc *e,int cond)

{
  uint uVar1;
  int iVar2;
  int iVar4;
  uint uVar5;
  Instruction *pIVar3;
  
  if (e->k == VRELOC) {
    pIVar3 = fs->f->code;
    uVar1 = pIVar3[(e->u).info];
    uVar5 = uVar1 & 0x7f;
    if (uVar5 == 0x33) {
      iVar4 = (int)fs->f->lineinfo[(long)fs->pc + -1];
      if (iVar4 == -0x80) {
        fs->nabslineinfo = fs->nabslineinfo + -1;
        fs->iwthabs = 0x81;
      }
      else {
        fs->previousline = fs->previousline - iVar4;
        fs->iwthabs = fs->iwthabs + 0xff;
      }
      fs->pc = fs->pc + -1;
      luaK_code(fs,(uint)(cond == 0) * 0x8000 + (uVar1 >> 9 & 0x7f80) + 0x42);
      uVar1 = luaK_code(fs,0x7fffff38);
      pIVar3 = (Instruction *)(ulong)uVar1;
    }
    if (uVar5 == 0x33) {
      return (int)pIVar3;
    }
  }
  discharge2anyreg(fs,e);
  if (e->k == VNONRELOC) {
    iVar4 = (e->u).info;
    iVar2 = luaY_nvarstack(fs);
    if (iVar2 <= iVar4) {
      fs->freereg = fs->freereg + 0xff;
    }
  }
  luaK_code(fs,cond << 0xf | (e->u).info << 0x10 | 0x7fc3);
  iVar4 = luaK_code(fs,0x7fffff38);
  return iVar4;
}

Assistant:

static int jumponcond (FuncState *fs, expdesc *e, int cond) {
  if (e->k == VRELOC) {
    Instruction ie = getinstruction(fs, e);
    if (GET_OPCODE(ie) == OP_NOT) {
      removelastinstruction(fs);  /* remove previous OP_NOT */
      return condjump(fs, OP_TEST, GETARG_B(ie), 0, 0, !cond);
    }
    /* else go through */
  }
  discharge2anyreg(fs, e);
  freeexp(fs, e);
  return condjump(fs, OP_TESTSET, NO_REG, e->u.info, 0, cond);
}